

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  double dVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  _Tuple_impl<1UL,_int,_int> _Var4;
  char cVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  _InputArray *p_Var9;
  ostream *poVar10;
  iterator iVar11;
  mapped_type *this;
  _Base_ptr p_Var12;
  long *plVar13;
  char *__s;
  size_t sVar14;
  long lVar15;
  ulong uVar16;
  _Self __tmp;
  long lVar17;
  int in_R8D;
  double dVar18;
  int bStep;
  int aStep;
  int lStep;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> shadowPoints;
  string s;
  map<std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
  labMap;
  Mat maskAvgL;
  int local_818;
  uint uStack_814;
  undefined8 *local_7e0;
  long *local_7d8;
  Mat maskFinal;
  undefined4 uStack_7b4;
  long *local_770;
  undefined1 local_758 [16];
  long local_748;
  string srcPath;
  stringstream sstm;
  _Head_base<1UL,_int,_false> _Stack_714;
  Mat *local_710;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_708 [4];
  Mat local_6a8 [16];
  ios_base local_698 [80];
  Mat local_648 [184];
  Mat imgL;
  long local_580;
  undefined8 *local_550;
  long *local_548;
  time_t end_time;
  Mat *local_528;
  Size local_520;
  Mat imgB;
  long local_508;
  long *local_4d0;
  Mat imgA;
  long local_4a8;
  long *local_470;
  Mat stdDevL;
  double *local_448;
  Mat meanL;
  double *local_3e8;
  Mat imgLD;
  long *local_350;
  Mat bFiltered;
  Mat aFiltered;
  Mat lFiltered;
  Mat imgRGB;
  Mat imgLAB;
  _InputArray local_158 [4];
  Mat local_f8 [96];
  Mat local_98 [104];
  
  if (argc == 5) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&srcPath,argv[1],(allocator<char> *)&sstm);
    iVar6 = atoi(argv[2]);
    lStep = iVar6;
    iVar7 = atoi(argv[3]);
    aStep = iVar7;
    bStep = atoi(argv[4]);
    if (iVar6 < 1 || (bStep < 1 || iVar7 < 1)) {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
      std::ostream::put('H');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Wrong argument! lStep, aStep and bStep must be positive.",
                 0x38);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
      std::ostream::put('H');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Run this executable by invoking it like this: ",0x2e);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
      std::ostream::put('H');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "   ./ShadowDet ../data/flickr-4159721472_c55deb37d6_b.jpg 20 50 50",0x42);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
      std::ostream::put('H');
      std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
      std::ostream::put('H');
      iVar6 = 1;
      std::ostream::flush();
    }
    else {
      lVar8 = std::chrono::_V2::system_clock::now();
      cv::Mat::Mat(&imgRGB);
      cv::imread((string *)&sstm,(int)&srcPath);
      cv::Mat::operator=(&imgRGB,(Mat *)&sstm);
      cv::Mat::~Mat((Mat *)&sstm);
      cVar5 = cv::Mat::empty();
      if (cVar5 == '\0') {
        cv::Mat::Mat(&imgLAB);
        local_708[0].super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        _sstm = 0x1010000;
        local_158[0].sz.width = 0;
        local_158[0].sz.height = 0;
        local_158[0].flags = 0x2010000;
        local_158[0].obj = &imgLAB;
        cv::cvtColor((cv *)&sstm,local_158,(_OutputArray *)0x2d,0,in_R8D);
        lVar17 = 0;
        do {
          cv::Mat::Mat((Mat *)((long)&local_158[0].flags + lVar17));
          lVar17 = lVar17 + 0x60;
        } while (lVar17 != 0x120);
        cv::split(&imgLAB,(Mat *)local_158);
        cv::Mat::Mat(&imgL,(Mat *)local_158);
        cv::Mat::Mat(&imgA,local_f8);
        cv::Mat::Mat(&imgB,local_98);
        cv::Mat::Mat(&lFiltered);
        local_708[0].super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        _sstm = 0x1010000;
        _aFiltered = 0x2010000;
        cv::bilateralFilter((_InputArray *)&sstm,(_OutputArray *)&aFiltered,5,80.0,80.0,4);
        cv::Mat::operator=(&imgL,&lFiltered);
        cv::Mat::release();
        cv::Mat::Mat(&aFiltered);
        local_708[0].super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        _sstm = 0x1010000;
        _bFiltered = 0x2010000;
        cv::bilateralFilter((_InputArray *)&sstm,(_OutputArray *)&bFiltered,5,80.0,80.0,4);
        cv::Mat::operator=(&imgA,&aFiltered);
        cv::Mat::release();
        cv::Mat::Mat(&bFiltered);
        local_708[0].super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        _sstm = 0x1010000;
        local_710 = &imgLD;
        _imgLD = 0x2010000;
        cv::bilateralFilter((_InputArray *)&sstm,(_OutputArray *)local_710,5,80.0,80.0,4);
        cv::Mat::operator=(&imgB,&bFiltered);
        cv::Mat::release();
        cv::Mat::Mat(local_710);
        cv::Mat::Mat(&meanL);
        cv::Mat::Mat(&stdDevL);
        local_708[0].super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        _sstm = 0x2010000;
        cv::Mat::convertTo((_OutputArray *)&imgL,(int)&sstm,1.0,0.0);
        local_708[0].super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        _sstm = 0x1010000;
        _maskAvgL = 0x2010000;
        _maskFinal = 0x2010000;
        p_Var9 = (_InputArray *)cv::noArray();
        cv::meanStdDev((_InputArray *)&sstm,(_OutputArray *)&maskAvgL,(_OutputArray *)&maskFinal,
                       p_Var9);
        dVar1 = *local_448;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Mean lightness value: ",0x16);
        poVar10 = std::ostream::_M_insert<double>(*local_3e8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,", standard deviation: ",0x16);
        poVar10 = std::ostream::_M_insert<double>(*local_448);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," useSTD: ",9);
        poVar10 = std::ostream::_M_insert<bool>(SUB81(poVar10,0));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        uVar2 = *local_550;
        _maskFinal = (int)((ulong)uVar2 >> 0x20);
        cv::Mat::zeros(&sstm,&maskFinal,0);
        cv::Mat::Mat(&maskAvgL);
        (**(code **)(*(long *)_sstm + 0x18))(_sstm,&sstm,&maskAvgL,0xffffffff);
        cv::Mat::~Mat(local_648);
        cv::Mat::~Mat(local_6a8);
        cv::Mat::~Mat((Mat *)local_708);
        local_818 = (int)&meanL;
        uStack_814 = (uint)((ulong)&meanL >> 0x20);
        if (local_818 < 1) {
          iVar6 = 0;
        }
        else {
          lVar17 = 0;
          uVar16 = (ulong)uStack_814;
          iVar6 = 0;
          do {
            if (0 < (int)uVar16) {
              lVar15 = 0;
              do {
                dVar18 = *local_3e8;
                if (42.5 <= dVar1) {
                  dVar18 = dVar18 + *local_448 / -3.0;
                }
                if (dVar18 <= *(double *)(*local_350 * lVar17 + lVar15 * 8)) {
                  *(undefined1 *)(lVar15 + *local_7d8 * lVar17) = 0;
                }
                else {
                  *(char *)(lVar15 + *local_7d8 * lVar17) =
                       *(char *)(lVar15 + *local_548 * lVar17 + local_580) + '\x01';
                  iVar6 = iVar6 + 1;
                }
                lVar15 = lVar15 + 1;
                uVar16 = (ulong)(int)uStack_814;
              } while (lVar15 < (long)uVar16);
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 < local_818);
        }
        _sstm = (_Tuple_impl<1UL,_int,_int>)local_708;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&sstm,"../results/mask_step_one.jpg","");
        _maskFinal = (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
                     CONCAT44((int)uVar2,0x1010000);
        labMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        labMap._M_t._M_impl._0_8_ = 0;
        labMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        labMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        cv::imwrite((string *)&sstm,(_InputArray *)&maskFinal,(vector *)&labMap);
        if (labMap._M_t._M_impl._0_8_ != 0) {
          operator_delete((void *)labMap._M_t._M_impl._0_8_,
                          (long)labMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent -
                          labMap._M_t._M_impl._0_8_);
        }
        if (_sstm != (_Tuple_impl<1UL,_int,_int>)local_708) {
          operator_delete((void *)_sstm,
                          (long)local_708[0].
                                super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1);
        }
        labMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &labMap._M_t._M_impl.super__Rb_tree_header._M_header;
        labMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             labMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        iVar7 = 0;
        labMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        labMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        labMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             labMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if (0 < local_818) {
          lVar17 = 0;
          do {
            if (0xffffffff < (long)&meanL) {
              lVar15 = 0;
              do {
                if (*(char *)(lVar15 + *local_7d8 * lVar17) != '\0') {
                  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)CONCAT44((int)lVar15,(int)lVar17);
                  s._M_dataplus._M_p =
                       (pointer)CONCAT44((int)((long)(ulong)*(byte *)(lVar15 + *local_470 * lVar17 +
                                                                               local_4a8) /
                                              (long)aStep),
                                         (int)((long)(ulong)*(byte *)(lVar15 + *local_4d0 * lVar17 +
                                                                               local_508) /
                                              (long)bStep));
                  s._M_string_length._0_4_ =
                       (undefined4)
                       ((long)(ulong)*(byte *)(lVar15 + *local_548 * lVar17 + local_580) /
                       (long)lStep);
                  iVar11 = std::
                           _Rb_tree<std::tuple<int,_int,_int>,_std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>,_std::_Select1st<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
                           ::find((_Rb_tree<std::tuple<int,_int,_int>,_std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>,_std::_Select1st<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
                                   *)&labMap,(key_type *)&s);
                  if ((_Rb_tree_header *)iVar11._M_node ==
                      &labMap._M_t._M_impl.super__Rb_tree_header) {
                    _maskFinal = (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)0x0;
                    std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
                              ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
                               &maskFinal,(value_type *)&threads);
                    local_710 = (Mat *)CONCAT44(local_710._4_4_,(undefined4)s._M_string_length);
                    _sstm = (_Tuple_impl<1UL,_int,_int>)s._M_dataplus._M_p;
                    std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
                              (local_708,
                               (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
                               &maskFinal);
                    std::
                    _Rb_tree<std::tuple<int,int,int>,std::pair<std::tuple<int,int,int>const,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>,std::_Select1st<std::pair<std::tuple<int,int,int>const,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>,std::less<std::tuple<int,int,int>>,std::allocator<std::pair<std::tuple<int,int,int>const,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>>
                    ::
                    _M_emplace_unique<std::pair<std::tuple<int,int,int>,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
                              ((_Rb_tree<std::tuple<int,int,int>,std::pair<std::tuple<int,int,int>const,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>,std::_Select1st<std::pair<std::tuple<int,int,int>const,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>,std::less<std::tuple<int,int,int>>,std::allocator<std::pair<std::tuple<int,int,int>const,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>>
                                *)&labMap,
                               (pair<std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                                *)&sstm);
                    if ((Size)local_708[0].
                              super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start != (Size)0x0) {
                      operator_delete(local_708[0].
                                      super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_708[0].
                                            super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_708[0].
                                            super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (_maskFinal !=
                        (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)0x0) {
                      operator_delete(_maskFinal,-(long)_maskFinal);
                    }
                  }
                  else {
                    this = std::
                           map<std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
                           ::operator[](&labMap,(key_type *)&s);
                    std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
                              (this,(value_type *)&threads);
                  }
                }
                lVar15 = lVar15 + 1;
              } while (lVar15 < (int)uStack_814);
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 < local_818);
          iVar7 = 0;
          if ((_Rb_tree_header *)labMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
              &labMap._M_t._M_impl.super__Rb_tree_header) {
            p_Var12 = labMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            iVar7 = 0;
            do {
              std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
                        ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&sstm,
                         (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
                         &p_Var12[1]._M_left);
              _Var4 = _sstm;
              if (_sstm != (_Tuple_impl<1UL,_int,_int>)0x0) {
                operator_delete((void *)_sstm,
                                (long)local_708[0].
                                      super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start - (long)_sstm);
              }
              iVar7 = iVar7 + (int)((ulong)((long)local_710 - (long)_Var4) >> 3);
              p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
            } while ((_Rb_tree_header *)p_Var12 != &labMap._M_t._M_impl.super__Rb_tree_header);
          }
        }
        if (iVar6 == iVar7) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"labMap succesfully created. Entries in labMap: ",0x2f);
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
        }
        iVar6 = std::thread::hardware_concurrency();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Max threads concurrent: ",0x18);
        plVar13 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
        std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
        std::ostream::put((char)plVar13);
        std::ostream::flush();
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        shadowPoints.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        shadowPoints.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        shadowPoints.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        if ((_Rb_tree_header *)labMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
            &labMap._M_t._M_impl.super__Rb_tree_header) {
          p_Var12 = labMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            if ((ulong)((long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3) < (ulong)(long)iVar6) {
              _maskFinal = &shadowPoints;
              std::thread::
              thread<void(&)(cv::Mat,cv::Mat,cv::Mat,std::tuple<int,int,int>,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,int,int,int,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>&),cv::Mat&,cv::Mat&,cv::Mat&,std::tuple<int,int,int>const&,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>&,int_const&,int_const&,int_const&,std::reference_wrapper<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>,void>
                        ((thread *)&sstm,findShadow,&imgL,&imgA,&imgB,
                         (tuple<int,_int,_int> *)(p_Var12 + 1),
                         (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
                         &p_Var12[1]._M_left,&lStep,&aStep,&bStep,
                         (reference_wrapper<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                          *)&maskFinal);
              std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                        (&threads,(thread *)&sstm);
              if (_sstm != (_Tuple_impl<1UL,_int,_int>)0x0) {
                std::terminate();
              }
              p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
            }
            else {
              if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                lVar17 = 0;
              }
              else {
                uVar16 = 0;
                do {
                  std::thread::join();
                  uVar16 = uVar16 + 1;
                  lVar17 = (long)threads.
                                 super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)threads.
                                 super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
                } while (uVar16 < (ulong)(lVar17 >> 3));
              }
              std::vector<std::thread,_std::allocator<std::thread>_>::_M_erase
                        (&threads,(iterator)
                                  threads.
                                  super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                         (thread *)
                         ((long)&((threads.
                                   super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->_M_id)._M_thread +
                         lVar17));
            }
          } while ((_Rb_tree_header *)p_Var12 != &labMap._M_t._M_impl.super__Rb_tree_header);
        }
        if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_start) {
          lVar17 = 0;
        }
        else {
          uVar16 = 0;
          do {
            std::thread::join();
            uVar16 = uVar16 + 1;
            lVar17 = (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                           _M_impl.super__Vector_impl_data._M_start;
          } while (uVar16 < (ulong)(lVar17 >> 3));
        }
        std::vector<std::thread,_std::allocator<std::thread>_>::_M_erase
                  (&threads,(iterator)
                            threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                   (thread *)
                   ((long)&((threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                             _M_impl.super__Vector_impl_data._M_start)->_M_id)._M_thread + lVar17));
        s._M_dataplus._M_p = (pointer)CONCAT44((int)*local_7e0,(int)((ulong)*local_7e0 >> 0x20));
        cv::Mat::zeros(&sstm,&s,0);
        cv::Mat::Mat(&maskFinal);
        (**(code **)(*(long *)_sstm + 0x18))(_sstm,&sstm,&maskFinal);
        cv::Mat::~Mat(local_648);
        cv::Mat::~Mat(local_6a8);
        cv::Mat::~Mat((Mat *)local_708);
        if (shadowPoints.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            shadowPoints.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          uVar16 = 0;
          do {
            *(undefined1 *)
             ((long)shadowPoints.
                    super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar16].y +
             (long)shadowPoints.
                   super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar16].x * *local_770) = 0xff;
            uVar16 = uVar16 + 1;
          } while (uVar16 < (ulong)((long)shadowPoints.
                                          super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)shadowPoints.
                                          super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        std::__cxx11::stringstream::stringstream((stringstream *)&sstm);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_708,"../results/mask_step_two_lStep",0x1e);
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)local_708,lStep);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"_aStep",6);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,aStep);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"_bStep",6);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,bStep);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,".jpg",4);
        std::__cxx11::stringbuf::str();
        local_520.width = 0;
        local_520.height = 0;
        end_time = CONCAT44(end_time._4_4_,0x1010000);
        local_748 = 0;
        local_758 = (undefined1  [16])0x0;
        local_528 = &maskFinal;
        cv::imwrite((string *)&s,(_InputArray *)&end_time,(vector *)local_758);
        if ((void *)local_758._0_8_ != (void *)0x0) {
          operator_delete((void *)local_758._0_8_,local_748 - local_758._0_8_);
        }
        lVar17 = std::chrono::_V2::system_clock::now();
        auVar3 = SEXT816(lVar17 - lVar8) * SEXT816(0x431bde82d7b634db);
        end_time = lVar17 / 1000000000;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Finished computation at ",0x18);
        __s = ctime(&end_time);
        if (__s == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10d148);
        }
        else {
          sVar14 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar14);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout," Elapsed time: ",0xf);
        poVar10 = (ostream *)
                  std::ostream::operator<<
                            ((ostream *)&std::cout,
                             (int)(auVar3._8_8_ >> 0x12) - (auVar3._12_4_ >> 0x1f));
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," ms",3);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)s._M_dataplus._M_p != &s.field_2) {
          operator_delete(s._M_dataplus._M_p,s.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&sstm);
        std::ios_base::~ios_base(local_698);
        cv::Mat::~Mat(&maskFinal);
        if (shadowPoints.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(shadowPoints.
                          super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)shadowPoints.
                                super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)shadowPoints.
                                super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
        std::
        _Rb_tree<std::tuple<int,_int,_int>,_std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>,_std::_Select1st<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
        ::~_Rb_tree(&labMap._M_t);
        cv::Mat::~Mat(&maskAvgL);
        cv::Mat::~Mat(&stdDevL);
        cv::Mat::~Mat(&meanL);
        cv::Mat::~Mat(&imgLD);
        cv::Mat::~Mat(&bFiltered);
        cv::Mat::~Mat(&aFiltered);
        cv::Mat::~Mat(&lFiltered);
        cv::Mat::~Mat(&imgB);
        cv::Mat::~Mat(&imgA);
        cv::Mat::~Mat(&imgL);
        lVar8 = 0xc0;
        do {
          cv::Mat::~Mat((Mat *)((long)&local_158[0].flags + lVar8));
          lVar8 = lVar8 + -0x60;
        } while (lVar8 != -0x60);
        cv::Mat::~Mat(&imgLAB);
        iVar6 = 0;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Wrong argument! Can not open input image. Check for errors in the provided path"
                   ,0x4f);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
        std::ostream::put('H');
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Run this executable by invoking it like this: ",0x2e);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
        std::ostream::put('H');
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "   ./ShadowDet ../data/flickr-4159721472_c55deb37d6_b.jpg 50 50 50",0x42);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
        std::ostream::put('H');
        std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
        std::ostream::put('H');
        iVar6 = 1;
        std::ostream::flush();
      }
      cv::Mat::~Mat(&imgRGB);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)srcPath._M_dataplus._M_p != &srcPath.field_2) {
      operator_delete(srcPath._M_dataplus._M_p,srcPath.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Run this executable by invoking it like this: ",0x2e);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "   ./ShadowDet ../data/flickr-4159721472_c55deb37d6_b.jpg 20 50 50",0x42);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"The first argument is the input image path.",0x2b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The second argument is the lStep parameter. It must be positive.",0x40);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The third argument is the aStep parameter. It must be positive.",0x3f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The fourth argument is the bStep parameter. It must be positive.",0x40);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

int main(int argc, char** argv){

  if (argc != 5){
    cout << endl;
    cout << "Run this executable by invoking it like this: " << endl;
    cout << "   ./ShadowDet ../data/flickr-4159721472_c55deb37d6_b.jpg 20 50 50" << endl;
    cout << endl;
    cout << "The first argument is the input image path." << endl;
    cout << "The second argument is the lStep parameter. It must be positive." << endl;
    cout << "The third argument is the aStep parameter. It must be positive." << endl;
    cout << "The fourth argument is the bStep parameter. It must be positive." << endl;
    cout << endl;
    return 1;
  }

  const string srcPath = argv[1];
  const int lStep = atoi(argv[2]);
  const int aStep = atoi(argv[3]);
  const int bStep = atoi(argv[4]);

  if(aStep <= 0 || bStep <=0 || lStep <= 0){
    cout << endl;
    cout << "Wrong argument! lStep, aStep and bStep must be positive." << endl;
    cout << "Run this executable by invoking it like this: " << endl;
    cout << "   ./ShadowDet ../data/flickr-4159721472_c55deb37d6_b.jpg 20 50 50" << endl;
    cout << endl;
    return 1;
  }

  chrono::time_point<chrono::system_clock> start, end;
  start = chrono::system_clock::now();

  Mat imgRGB;
  imgRGB = imread(srcPath);

  if(imgRGB.empty()){
    cout << "Wrong argument! Can not open input image. Check for errors in the provided path" << endl;
    cout << "Run this executable by invoking it like this: " << endl;
    cout << "   ./ShadowDet ../data/flickr-4159721472_c55deb37d6_b.jpg 50 50 50" << endl;
    cout << endl;
    return 1;
  }

  // in this process we use CIE LAB color space
  Mat imgLAB;
  cvtColor(imgRGB, imgLAB, COLOR_RGB2Lab);

  Mat channelLAB[3];
  split(imgLAB, channelLAB);
  Mat imgL = channelLAB[0];
  Mat imgA = channelLAB[1];
  Mat imgB = channelLAB[2];

  //bilateral filter to reduce noise but preserve edges
  Mat lFiltered;
  bilateralFilter(imgL, lFiltered, 5, 80, 80);
  imgL = lFiltered;
  lFiltered.release();

  Mat aFiltered;
  bilateralFilter(imgA, aFiltered, 5, 80, 80);
  imgA = aFiltered;
  aFiltered.release();

  Mat bFiltered;
  bilateralFilter(imgB, bFiltered, 5, 80, 80);
  imgB = bFiltered;
  bFiltered.release();

  // compute the mean and the standard deviation of the luminance component
  // these values are considered as the "background light" so they allow to
  // distinguish "probably shadow pixels" (PSP) from surely "not shadow pixels" (NSP)
  Mat imgLD, meanL, stdDevL;
  bool useSTD = true;
  imgL.convertTo(imgLD, CV_64FC1);
  meanStdDev(imgLD, meanL, stdDevL);
  if(stdDevL.at<double> (0, 0) <  (double) 255 / 6){
    useSTD = false;
  }

  cout << "Mean lightness value: " << meanL.at<double> (0, 0) << ", standard deviation: " << stdDevL.at<double> (0, 0)
       << " useSTD: " << useSTD << endl;

  // create the mask
  Mat maskAvgL = Mat_<uchar>::zeros(imgL.size());

  // depending on the standard deviation on imgL, each pixel with lightness component less than meanL - stdDevL/3
  // or simply meanL is a PSP, otherwise it is a NSP.
  // in the resulting masks, each PSP value is set to the one assumed in the luminance image plus 1
  // while each NSP remains set to 0
  int maskPixels = 0;
  for(int i = 0; i < maskAvgL.rows; i++){
    for(int j = 0; j < maskAvgL.cols; j++){
      if(useSTD){
        if(imgLD.at<double> (i, j) < (meanL.at<double> (0, 0) - (stdDevL.at<double> (0, 0) / 3))){
          maskAvgL.at<uchar> (i, j) = 1 + imgL.at<uchar> (i, j);
          maskPixels++;
        }
        else{
          maskAvgL.at<uchar> (i, j) = 0;
        }
      }
      else{
        if(imgLD.at<double> (i, j) < meanL.at<double> (0, 0)){
          maskAvgL.at<uchar> (i, j) = 1 + imgL.at<uchar> (i, j);
          maskPixels++;
        }
        else{
          maskAvgL.at<uchar> (i, j) = 0;
        }
      }
    }
  }

  // write the files to see results
  imwrite("../results/mask_step_one.jpg", maskAvgL);

  // now further computation to detect the shadow pixels (SP) from the PSP
  map<tuple<int, int, int> , vector<Point> > labMap;
  map<tuple<int, int, int>, vector<Point> >::iterator labIt;

  // fill  labMap:
  // key = (l*, a*, b*) pixel component. It represents a color bin
  // value = points of the mask in the bin
  for (int i = 0; i < maskAvgL.rows; i++){
    for (int j = 0; j < maskAvgL.cols; j++){
      if (maskAvgL.at<uchar> (i, j) != 0){
        Point p(i, j);
        int theL = ceil(imgL.at<uchar> (i, j) / lStep);
        int theA = ceil(imgA.at<uchar> (i, j) / aStep);
        int theB = ceil(imgB.at<uchar> (i, j) / bStep);
        tuple<int, int, int> key = make_tuple(theL, theA, theB);

        labIt = labMap.find(key);
        if(labIt == labMap.end()){
          vector<Point> v;
          v.push_back(p);
          labMap.insert(pair<tuple<int, int, int>, vector<Point> >(key, v));
        }
        else{
          labMap[key].push_back(p);
        }
      }
    }
  }

  int labMapPixels = 0;
  for (labIt = labMap.begin(); labIt != labMap.end(); labIt++){
    vector<Point> labPixels = labIt->second;
    labMapPixels = labMapPixels + labPixels.size();
  }

  if(maskPixels == labMapPixels){
    cout << "labMap succesfully created. Entries in labMap: " << labMap.size() << endl;
  }

  // use thread pool to analyze each (key, value) pair in labMap
  const int poolSize = thread::hardware_concurrency();
  cout << "Max threads concurrent: " << poolSize << endl;
  vector<thread> threads;
  vector<Point> shadowPoints;
  labIt = labMap.begin();

  while(labIt != labMap.end()){
    if(threads.size() < poolSize){
      // lauch thread form the pool. See FindShadow.cpp for more information
      threads.push_back(thread(findShadow, imgL, imgA, imgB, labIt->first, labIt->second, lStep, aStep, bStep, ref(shadowPoints)));
      labIt++; // move to the next (key, value) pair in labMap
    }
    else{
      // wait for threads to finish their computation
      for(int t = 0; t < threads.size(); t++){
        threads[t].join();
      }
      // free the pool
      threads.erase(threads.begin(), threads.end());
    }
  }

  // wait for active threads remaining
  for(int t = 0; t < threads.size(); t++){
    threads[t].join();
  }
  // free the pool
  threads.erase(threads.begin(), threads.end());

  // write the final result
  Mat maskFinal = Mat_<uchar>::zeros(maskAvgL.size());

  for (int i = 0; i < shadowPoints.size(); i++){
    Point p = shadowPoints[i];
    maskFinal.at<uchar> (p.x, p.y) = 255;
  }

  stringstream sstm;
  sstm << "../results/mask_step_two_lStep" << lStep << "_aStep" << aStep << "_bStep" << bStep << ".jpg";
  string s = sstm.str();
  imwrite(s, maskFinal);

  // provide information to the user
  end = chrono::system_clock::now();
  int elapsed_seconds = chrono::duration_cast<std::chrono::milliseconds> (end-start).count();
  time_t end_time = chrono::system_clock::to_time_t(end);

  cout << "Finished computation at " << ctime(&end_time) << " Elapsed time: " << elapsed_seconds << " ms" << endl;

  return 0;
}